

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tilemap.cpp
# Opt level: O2

void __thiscall imgtogb::Tilemap::Tilemap(Tilemap *this,Image *img,int offset)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  bool bVar5;
  _Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_> _Var6;
  reference piVar7;
  uchar *puVar8;
  size_t iy;
  ulong j;
  long lVar9;
  long lVar10;
  ulong i;
  int iVar11;
  int iVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>,_std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>_>
  pVar13;
  int hash;
  Tile tile;
  int local_94;
  _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
  *local_90;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  Tile local_68;
  pair<int,_imgtogb::Tile> local_50;
  
  this->img = img;
  this->offset = offset;
  uVar2 = img->_width;
  uVar3 = img->_height;
  iVar11 = (int)(((uint)((int)uVar2 >> 0x1f) >> 0x1d) + uVar2) >> 3;
  iVar12 = (int)(((uint)((int)uVar3 >> 0x1f) >> 0x1d) + uVar3) >> 3;
  this->tiles_x = CONCAT44(-(uint)(iVar11 < 0),iVar11);
  *(int *)&this->ntiles = iVar12;
  *(uint *)((long)&this->ntiles + 4) = -(uint)(iVar12 < 0);
  this->ntiles = 0;
  local_88 = &this->tilemap;
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(local_88,(long)iVar11,(long)iVar12);
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = (_Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
              *)&this->map;
  local_80 = 0;
  j = 0;
  do {
    if (this->tiles_y <= j) {
      return;
    }
    local_78 = (ulong)(uint)((int)(local_80 >> 3) << 3);
    local_70 = 0;
    for (i = 0; i < this->tiles_x; i = i + 1) {
      local_68.id = (int)this->ntiles;
      puVar8 = img->_data + local_78 * img->_width + (ulong)((uint)local_70 & 0xfffffff8);
      local_94 = 0;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          local_94 = local_94 + (uint)puVar8[lVar10];
        }
        puVar8 = puVar8 + img->_width;
      }
      local_68.x = i;
      local_68.y = j;
      pVar13 = std::
               _Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
               ::equal_range((_Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
                              *)local_90,&local_94);
      _Var6 = pVar13.first._M_node;
      if (_Var6._M_node != pVar13.second._M_node._M_node) {
        for (; _Var6._M_node != pVar13.second._M_node._M_node;
            _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node)) {
          bVar5 = compare(&local_68,(Tile *)&_Var6._M_node[1]._M_parent,img);
          if (bVar5) {
            iVar11 = *(int *)&_Var6._M_node[1]._M_right;
            piVar7 = boost::numeric::ublas::
                     matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                     ::at_element(local_88,i,j);
            *piVar7 = iVar11;
            goto LAB_001389bf;
          }
        }
      }
      local_50.first = local_94;
      local_50.second._20_4_ = local_68._20_4_;
      local_50.second.id = local_68.id;
      local_50.second.x = local_68.x;
      local_50.second.y = local_68.y;
      std::
      _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
      ::_M_emplace_equal<std::pair<int,imgtogb::Tile>>(local_90,&local_50);
      sVar4 = this->ntiles;
      this->ntiles = sVar4 + 1;
      piVar7 = boost::numeric::ublas::
               matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               ::at_element(local_88,i,j);
      *piVar7 = (int)sVar4;
LAB_001389bf:
      local_70 = local_70 + 8;
    }
    j = j + 1;
    local_80 = local_80 + 8;
  } while( true );
}

Assistant:

Tilemap::Tilemap(
		const Image &img,
		int offset
	)
	: img(&img)
	, offset(offset)
	, tiles_x(img.width() / 8)
	, tiles_y(img.height() / 8)
	, ntiles(0)
	, tilemap(tiles_x, tiles_y)
	{
		for(size_t iy = 0; iy < tiles_y; ++iy) {
			for(size_t ix = 0; ix < tiles_x; ++ix) {
				Tile tile(ix, iy, ntiles);
				int hash = tile_hash(tile, img);

				// Look for existing tiles with same hash
				mmap_range range = map.equal_range(hash);
				bool found = range.first != range.second;

				if(found) {
					found = false;
					for(mmap::iterator it = range.first; it != range.second; ++it) {
						if(compare(tile, it->second, img) == true) {
							found = true;
							tilemap(ix, iy) = it->second.id;
							break;
						}
					}
				}

				// Add new tile if not found
				if(!found) {
					map.insert(std::pair<int,Tile>(hash, tile));
					tilemap(ix, iy) = ntiles++;
				}
			}
		}
	}